

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O2

void __thiscall Archive::dump(Archive *this)

{
  int iVar1;
  pointer pcVar2;
  uint8_t *buf;
  long lVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  string local_78;
  undefined1 auStack_58 [8];
  child_iterator c;
  
  pcVar2 = (this->data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  printf("Archive data %p len %zu, firstRegularData %p\n",pcVar2,
         (long)(this->data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)pcVar2,this->firstRegularData);
  printf("Symbol table %p, len %u\n",(this->symbolTable).data,(ulong)(this->symbolTable).len);
  printf("string table %p, len %u\n",(this->stringTable).data,(ulong)(this->stringTable).len);
  buf = (this->symbolTable).data;
  if (buf == (uint8_t *)0x0) {
    child_begin((child_iterator *)auStack_58,this,true);
    while (uVar4 = (uint)c.child.data,
          lVar3 = CONCAT26(c.child.parent._6_2_,CONCAT24(c.child.parent._4_2_,c.child.parent._0_4_))
          , lVar3 != 0) {
      Child::getName_abi_cxx11_(&local_78,(Child *)auStack_58);
      printf("Child %p, len %u, name %s, size %u\n",lVar3,(ulong)uVar4,
             CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_),
             (ulong)((uint)c.child.data - c.child.data._4_2_));
      std::__cxx11::string::~string((string *)&local_78);
      child_iterator::operator++((child_iterator *)auStack_58);
    }
  }
  else {
    uVar5 = read32be(buf);
    printf("Symbol count %u\n",(ulong)uVar5);
    if (uVar5 != 0) {
      iVar1 = *(int *)&(this->symbolTable).data;
      do {
        printf("Symbol %u, offset %u\n",0,(ulong)((((int)buf + uVar5 * 4) - iVar1) + 4));
        uVar6 = read32be((this->symbolTable).data);
        auStack_58 = (undefined1  [8])0x0;
        c.child.parent._0_4_ = 0;
        c.child.parent._4_2_ = 0;
        c.child.parent._6_2_ = 0;
        c.child.data._0_4_ = 0;
        c.child.data._4_2_ = 0;
        c.child.len._0_1_ = 0;
        Child::Child((Child *)&local_78,this,
                     (uint8_t *)
                     ((this->data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_start + uVar6),(bool *)&c.child.len);
        c.child.data._0_4_ = (uint)local_78.field_2._M_allocated_capacity._0_6_;
        c.child.data._4_2_ = (ushort)((uint6)local_78.field_2._0_6_ >> 0x20);
        c.child.parent._0_4_ = (undefined4)local_78._M_string_length;
        printf("Child %p, len %u\n",
               CONCAT26(local_78._M_string_length._6_2_,
                        CONCAT24(local_78._M_string_length._4_2_,
                                 (undefined4)local_78._M_string_length)),(ulong)(uint)c.child.data);
      } while( true );
    }
  }
  return;
}

Assistant:

void Archive::dump() const {
  printf("Archive data %p len %zu, firstRegularData %p\n",
         data.data(),
         data.size(),
         firstRegularData);
  printf("Symbol table %p, len %u\n", symbolTable.data, symbolTable.len);
  printf("string table %p, len %u\n", stringTable.data, stringTable.len);
  const uint8_t* buf = symbolTable.data;
  if (!buf) {
    for (auto c = child_begin(), e = child_end(); c != e; ++c) {
      printf("Child %p, len %u, name %s, size %u\n",
             c->data,
             c->len,
             c->getName().c_str(),
             c->getSize());
    }
    return;
  }
  uint32_t symbolCount = read32be(buf);
  printf("Symbol count %u\n", symbolCount);
  buf += sizeof(uint32_t) + (symbolCount * sizeof(uint32_t));
  uint32_t string_start_offset = buf - symbolTable.data;
  Symbol sym = {0, string_start_offset};
  while (sym.symbolIndex != symbolCount) {
    printf("Symbol %u, offset %u\n", sym.symbolIndex, sym.stringIndex);
    // get the member
    uint32_t offset = read32be(symbolTable.data + sym.symbolIndex * 4);
    auto* loc = (const uint8_t*)&data[offset];
    child_iterator it;
    it.child = Child(this, loc, &it.error);
    printf("Child %p, len %u\n", it.child.data, it.child.len);
  }
}